

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

char * helicsBrokerGetAddress(HelicsBroker broker)

{
  char *pcVar1;
  undefined8 *puVar2;
  
  pcVar1 = "";
  if (((broker != (HelicsBroker)0x0) && (*(int *)((long)broker + 0x14) == -0x5cb982e0)) &&
     (*broker != (long *)0x0)) {
    puVar2 = (undefined8 *)(**(code **)(**broker + 0x60))();
    pcVar1 = (char *)*puVar2;
  }
  return pcVar1;
}

Assistant:

const char* helicsBrokerGetAddress(HelicsBroker broker)
{
    auto* brk = getBroker(broker, nullptr);
    if (brk == nullptr) {
        return nullstrPtr;
    }

    const auto& add = brk->getAddress();
    return add.c_str();
}